

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O3

int soundfiler_writeascii(t_soundfiler *x,char *filename,t_asciiargs *a)

{
  int iVar1;
  _binbuf *x_00;
  ulong uVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  char path [1000];
  char acStack_418 [1000];
  
  x_00 = binbuf_new();
  canvas_makefilename(x->x_canvas,filename,acStack_418,1000);
  lVar4 = a->aa_nframes;
  if (200000 < lVar4) {
    post("warning: writing %d table points to ascii file!");
    lVar4 = a->aa_nframes;
  }
  lVar6 = 0;
  if (0 < lVar4) {
    lVar3 = (long)(int)a->aa_onsetframe;
    uVar2 = (ulong)(uint)a->aa_nchannels;
    lVar6 = 0;
    do {
      if (0 < (int)uVar2) {
        lVar4 = 0;
        do {
          binbuf_addv(x_00,"f",(double)(a->aa_vectors[lVar4][lVar3].w_float * a->aa_normfactor));
          lVar4 = lVar4 + 1;
          uVar2 = (ulong)a->aa_nchannels;
        } while (lVar4 < (long)uVar2);
        lVar4 = a->aa_nframes;
      }
      lVar6 = lVar6 + 1;
      lVar3 = lVar3 + 1;
    } while (lVar6 < lVar4);
  }
  binbuf_addv(x_00,";");
  iVar1 = binbuf_write(x_00,acStack_418,"",1);
  binbuf_free(x_00);
  iVar5 = (int)lVar6;
  if (iVar1 != 0) {
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int soundfiler_writeascii(t_soundfiler *x, const char *filename, t_asciiargs *a)
{
    char path[MAXPDSTRING];
    t_binbuf *b = binbuf_new();
    int i, j, frameswritten = 0, ret = 1;
#ifdef DEBUG_SOUNDFILE
    post("ascii write: frames %d onset %d channels %d",
        a->aa_nframes, a->aa_onsetframe, a->aa_nchannels);
#endif
    canvas_makefilename(x->x_canvas, filename, path, MAXPDSTRING);
    if (a->aa_nframes > 200000)
        post("warning: writing %d table points to ascii file!");
    for (i = a->aa_onsetframe; frameswritten < a->aa_nframes; ++i)
    {
        for (j = 0; j < a->aa_nchannels; ++j)
            binbuf_addv(b, "f", a->aa_vectors[j][i].w_float * a->aa_normfactor);
        frameswritten++;
    }
    binbuf_addv(b, ";");
    ret = binbuf_write(b, path, "", 1); /* convert semis to cr */
    binbuf_free(b);
    return (ret == 0 ? frameswritten : 0);
}